

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int unknowntag_start(archive_read *a,xar *xar,char *name)

{
  unknown_tag *puVar1;
  size_t local_48;
  unknown_tag *tag;
  char *name_local;
  xar *xar_local;
  archive_read *a_local;
  
  puVar1 = (unknown_tag *)malloc(0x20);
  if (puVar1 == (unknown_tag *)0x0) {
    archive_set_error(&a->archive,0xc,"Out of memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    puVar1->next = xar->unknowntags;
    (puVar1->name).s = (char *)0x0;
    (puVar1->name).length = 0;
    (puVar1->name).buffer_length = 0;
    (puVar1->name).length = 0;
    if (name == (char *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = strlen(name);
    }
    archive_strncat(&puVar1->name,name,local_48);
    if (xar->unknowntags == (unknown_tag *)0x0) {
      xar->xmlsts_unknown = xar->xmlsts;
      xar->xmlsts = UNKNOWN;
    }
    xar->unknowntags = puVar1;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
unknowntag_start(struct archive_read *a, struct xar *xar, const char *name)
{
	struct unknown_tag *tag;

	tag = malloc(sizeof(*tag));
	if (tag == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	tag->next = xar->unknowntags;
	archive_string_init(&(tag->name));
	archive_strcpy(&(tag->name), name);
	if (xar->unknowntags == NULL) {
#if DEBUG
		fprintf(stderr, "UNKNOWNTAG_START:%s\n", name);
#endif
		xar->xmlsts_unknown = xar->xmlsts;
		xar->xmlsts = UNKNOWN;
	}
	xar->unknowntags = tag;
	return (ARCHIVE_OK);
}